

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall
cs::compiler_type::preprocessor::preprocessor
          (preprocessor *this,context_t *context,compiler_type *compiler,
          deque<char,_std::allocator<char>_> *char_buff,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens,charset encoding)

{
  bool bVar1;
  int iVar2;
  compile_error *this_00;
  undefined8 in_RCX;
  undefined8 *in_RDI;
  char *ch;
  const_iterator __end2;
  const_iterator __begin2;
  deque<char,_std::allocator<char>_> *__range2;
  charset *in_stack_00000370;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_00000378;
  compiler_type *in_stack_00000380;
  context_t *in_stack_00000388;
  preprocessor *in_stack_00000390;
  _Self *in_stack_ffffffffffffff08;
  _Self *in_stack_ffffffffffffff10;
  allocator local_b1;
  string local_b0 [48];
  char *local_80;
  _Deque_iterator<char,_const_char_&,_const_char_*> local_58;
  undefined8 local_38;
  undefined8 local_20;
  
  *in_RDI = 1;
  in_RDI[1] = 1;
  *(undefined1 *)(in_RDI + 2) = 0;
  *(undefined1 *)((long)in_RDI + 0x11) = 0;
  *(undefined1 *)((long)in_RDI + 0x12) = 0;
  *(undefined1 *)((long)in_RDI + 0x13) = 1;
  *(undefined1 *)((long)in_RDI + 0x14) = 1;
  local_20 = in_RCX;
  std::deque<char,_std::allocator<char>_>::deque((deque<char,_std::allocator<char>_> *)0x5cc765);
  std::__cxx11::string::string((string *)(in_RDI + 0xd));
  std::__cxx11::string::string((string *)(in_RDI + 0x11));
  local_38 = local_20;
  std::deque<char,_std::allocator<char>_>::begin
            ((deque<char,_std::allocator<char>_> *)in_stack_ffffffffffffff08);
  std::deque<char,_std::allocator<char>_>::end
            ((deque<char,_std::allocator<char>_> *)in_stack_ffffffffffffff08);
  do {
    bVar1 = std::operator!=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    if (!bVar1) {
      process_endline(in_stack_00000390,in_stack_00000388,in_stack_00000380,in_stack_00000378,
                      in_stack_00000370);
      if ((*(byte *)((long)in_RDI + 0x12) & 1) == 0) {
        return;
      }
      this_00 = (compile_error *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"Lack of the @end command.",&local_b1);
      compile_error::compile_error(this_00,(string *)in_stack_ffffffffffffff08);
      __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
    }
    local_80 = std::_Deque_iterator<char,_const_char_&,_const_char_*>::operator*(&local_58);
    if (*local_80 == '\n') {
      process_endline(in_stack_00000390,in_stack_00000388,in_stack_00000380,in_stack_00000378,
                      in_stack_00000370);
    }
    else if ((*(byte *)(in_RDI + 2) & 1) == 0) {
      if ((*(byte *)((long)in_RDI + 0x11) & 1) == 0) {
        if (((*(byte *)((long)in_RDI + 0x14) & 1) == 0) ||
           (iVar2 = isspace((int)*local_80), iVar2 != 0)) {
LAB_005cc8f5:
          if ((*(byte *)((long)in_RDI + 0x13) & 1) == 0) {
            std::deque<char,_std::allocator<char>_>::push_back
                      ((deque<char,_std::allocator<char>_> *)in_stack_ffffffffffffff10,
                       (value_type *)in_stack_ffffffffffffff08);
            std::__cxx11::string::push_back((char)in_RDI + -0x78);
          }
        }
        else if (*local_80 == '#') {
          *(undefined1 *)(in_RDI + 2) = 1;
        }
        else {
          if (*local_80 != '@') {
            *(undefined1 *)((long)in_RDI + 0x13) = 0;
            *(undefined1 *)((long)in_RDI + 0x14) = 0;
            goto LAB_005cc8f5;
          }
          *(undefined1 *)((long)in_RDI + 0x11) = 1;
        }
      }
      else {
        iVar2 = isspace((int)*local_80);
        if (iVar2 == 0) {
          std::__cxx11::string::push_back((char)in_RDI + 'h');
        }
      }
    }
    std::_Deque_iterator<char,_const_char_&,_const_char_*>::operator++(in_stack_ffffffffffffff10);
  } while( true );
}

Assistant:

explicit preprocessor(const context_t &context, compiler_type &compiler, const std::deque<char> &char_buff,
		                      std::deque<token_base *> &tokens, charset encoding)
		{
			for (auto &ch: char_buff) {
				if (ch == '\n') {
					process_endline(context, compiler, tokens, encoding);
					continue;
				}
				if (is_annotation)
					continue;
				if (is_command) {
					if (!std::isspace(ch))
						command.push_back(ch);
					continue;
				}
				if (empty_line && !std::isspace(ch)) {
					switch (ch) {
					case '#':
						is_annotation = true;
						continue;
					case '@':
						is_command = true;
						continue;
					default:
						empty_buff = false;
						empty_line = false;
						break;
					}
				}
				if (!empty_buff) {
					buff.push_back(ch);
					line.push_back(ch);
				}
			}
			process_endline(context, compiler, tokens, encoding);
			if (multi_line)
				throw compile_error("Lack of the @end command.");
		}